

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall bloaty::Bloaty::AddSourceMapFilename(Bloaty *this,string *filename)

{
  long lVar1;
  mapped_type *pmVar2;
  Arg *in_R8;
  string_view format;
  string sourcemap_filename;
  string sourcemap_build_id;
  string local_68;
  key_type local_48;
  
  lVar1 = std::__cxx11::string::find((char)filename,0x3d);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)filename);
    std::__cxx11::string::substr((ulong)&local_68,(ulong)filename);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->sourcemap_files_,&local_48);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_48._M_string_length = (size_type)(filename->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)filename->_M_string_length;
  format._M_str = (char *)&local_48;
  format._M_len =
       (size_t)"Source map filename \'$0\' must have a build id and file name separated by \'=\'";
  absl::Substitute_abi_cxx11_(&local_68,(absl *)0x4c,format,in_R8);
  Throw(local_68._M_dataplus._M_p,0x643);
}

Assistant:

void Bloaty::AddSourceMapFilename(const std::string& filename) {
  std::size_t delimiter = filename.find('=');
  if (delimiter == std::string::npos) {
    THROWF("Source map filename '$0' must have a build id and file name "
           "separated by '='",
           filename);
  }
  std::string sourcemap_build_id = filename.substr(0, delimiter);
  std::string sourcemap_filename = filename.substr(delimiter + 1);
  sourcemap_files_[sourcemap_build_id] = sourcemap_filename;
}